

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

CURLcode Curl_cf_def_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cf_def_cntrl(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                int event, int arg1, void *arg2)
{
  (void)cf;
  (void)data;
  (void)event;
  (void)arg1;
  (void)arg2;
  return CURLE_OK;
}